

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericvar.cpp
# Opt level: O2

double __thiscall MetaSim::GenericVar::get(GenericVar *this)

{
  _Rb_tree_node_base *p_Var1;
  Exc *this_00;
  double dVar2;
  allocator local_6a;
  allocator local_69;
  double local_68;
  double local_60;
  string local_58;
  string local_38;
  
  local_68 = UniformVar::get(&this->super_UniformVar);
  p_Var1 = (this->_pdf)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  dVar2 = 0.0;
  while( true ) {
    if ((_Rb_tree_header *)p_Var1 == &(this->_pdf)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = (Exc *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string((string *)&local_38,"Panic",&local_69);
      std::__cxx11::string::string((string *)&local_58,"GenericVar",&local_6a);
      RandomVar::Exc::Exc(this_00,&local_38,&local_58);
      __cxa_throw(this_00,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
    }
    local_60 = dVar2 + (double)p_Var1[1]._M_parent;
    if (local_68 < local_60) break;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    dVar2 = local_60;
  }
  return (double)(int)p_Var1[1]._M_color;
}

Assistant:

double GenericVar::get()
    {
        double v, CDF;
        map<int, double>::iterator i;

        v = UniformVar::get();
        CDF = 0;

        for(i = _pdf.begin(); i != _pdf.end(); i++) {
            CDF = CDF + i->second;
            if (CDF > v) {
                return i->first;
            }
        }

        /* We cannot arrive here... */
        /* It means that v > 1 or that lim_{i -> \infty} CDF < 1... */
        throw Exc("Panic", "GenericVar");
    }